

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolOccurrenceReplacement.cpp
# Opt level: O0

Formula * __thiscall
SymbolOccurrenceReplacement::process(SymbolOccurrenceReplacement *this,Formula *formula)

{
  Connective CVar1;
  Formula *pFVar2;
  Formula *in_RSI;
  Literal *processedLiteral;
  uint var;
  Iterator fvit;
  Substitution substitution;
  TermStack arguments;
  TermList *arg;
  bool renaming;
  Literal *literal;
  
  CVar1 = Kernel::Formula::connective(in_RSI);
  pFVar2 = (Formula *)(*(code *)(&DAT_00f1ca7c + *(int *)(&DAT_00f1ca7c + (ulong)CVar1 * 4)))();
  return pFVar2;
}

Assistant:

Formula* SymbolOccurrenceReplacement::process(Formula* formula) {
  switch (formula->connective()) {
    case LITERAL: {
      Literal* literal = formula->literal();

      bool renaming = _isPredicate && (literal->functor() == _symbol);

      TermList* arg = literal->args();
      TermStack arguments;
      Substitution substitution;

      if (renaming) {
        VList::Iterator fvit(_argVars);
        while (fvit.hasNext()) {
          unsigned var = fvit.next();
          substitution.bind(var, process(*arg));
          arg = arg->next();
        }
      } else {
        while (!arg->isEmpty()) {
          if(arg->isVar() || arg->term()->isSort()){
            arguments.push(*arg);
          } else {
            arguments.push(process(*arg));
          }
          arg = arg->next();
        }    
      }

      Literal* processedLiteral;
      if (renaming) {
        processedLiteral = SubstHelper::apply(static_cast<Literal*>(_freshApplication), substitution);
        if(!literal->polarity()){
          processedLiteral = Literal::complementaryLiteral(processedLiteral);
        }
      } else {
        processedLiteral = Literal::create(literal, arguments.begin());
      }

      return new AtomicFormula(processedLiteral);
    }

    case AND:
    case OR:
      return new JunctionFormula(formula->connective(), process(formula->args()));

    case IMP:
    case IFF:
    case XOR:
      return new BinaryFormula(formula->connective(), process(formula->left()), process(formula->right()));

    case NOT:
      return new NegatedFormula(process(formula->uarg()));

    case FORALL:
    case EXISTS:
      return new QuantifiedFormula(formula->connective(), formula->vars(), formula->sorts(), process(formula->qarg()));

    case BOOL_TERM:
      return new BoolTermFormula(process(formula->getBooleanTerm()));

    case TRUE:
    case FALSE:
      return formula;

    case NAME:
    case NOCONN:
      ASSERTION_VIOLATION;
    }

  ASSERTION_VIOLATION;
}